

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_array.cc
# Opt level: O2

void __thiscall
ArrayType::GenElementAssignment
          (ArrayType *this,Output *out_cc,Env *env,string *array_str,bool use_vector)

{
  pointer pcVar1;
  char *pcVar2;
  char *pcVar3;
  ID *pIVar4;
  
  if ((this->super_Type).attr_transient_ == true) {
    if (this->elem_var_field_ == (Field *)0x0) {
      pIVar4 = (ID *)0x0;
    }
    else {
      pIVar4 = this->elem_var_field_->id_;
    }
    pcVar2 = Env::LValue(env,pIVar4);
    Output::println(out_cc,"delete %s;",pcVar2);
    return;
  }
  pcVar1 = (array_str->_M_dataplus)._M_p;
  if (use_vector) {
    if (this->elem_var_field_ == (Field *)0x0) {
      pIVar4 = (ID *)0x0;
    }
    else {
      pIVar4 = this->elem_var_field_->id_;
    }
    pcVar2 = Env::LValue(env,pIVar4);
    Output::println(out_cc,"%s->push_back(%s);",pcVar1,pcVar2);
    return;
  }
  if (this->elem_it_var_field_ == (Field *)0x0) {
    pIVar4 = (ID *)0x0;
  }
  else {
    pIVar4 = this->elem_it_var_field_->id_;
  }
  pcVar2 = Env::LValue(env,pIVar4);
  if (this->elem_var_field_ == (Field *)0x0) {
    pIVar4 = (ID *)0x0;
  }
  else {
    pIVar4 = this->elem_var_field_->id_;
  }
  pcVar3 = Env::LValue(env,pIVar4);
  Output::println(out_cc,"%s[%s] = %s;",pcVar1,pcVar2,pcVar3);
  return;
}

Assistant:

void ArrayType::GenElementAssignment(Output* out_cc, Env* env, string const& array_str,
                                     bool use_vector)
	{
	if ( attr_transient_ )
		{
		// Just discard.
		out_cc->println("delete %s;", env->LValue(elem_var()));
		return;
		}

	// Assign the element
	if ( ! use_vector )
		{
		out_cc->println("%s[%s] = %s;", array_str.c_str(), env->LValue(elem_it_var()),
		                env->LValue(elem_var()));
		}
	else
		{
		out_cc->println("%s->push_back(%s);", array_str.c_str(), env->LValue(elem_var()));
		}
	}